

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
::fill_internal_duplex
          (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,float *in_buffer,long *input_frames_count,float *out_buffer,
          long output_frames_needed)

{
  cubeb_resampler_speex_one_way<float> *pcVar1;
  uint32_t uVar2;
  size_t sVar3;
  float *pfVar4;
  float *pfVar5;
  ulong frame_count;
  size_t frames_resampled;
  size_t local_38;
  
  pcVar1 = (this->output_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (this->draining == true) {
    sVar3 = cubeb_resampler_speex_one_way<float>::output(pcVar1,out_buffer,output_frames_needed);
    return sVar3;
  }
  uVar2 = cubeb_resampler_speex_one_way<float>::input_needed_for_output
                    (pcVar1,(int32_t)output_frames_needed);
  frame_count = (ulong)uVar2;
  pfVar4 = cubeb_resampler_speex_one_way<float>::input_buffer
                     ((this->output_processor)._M_t.
                      super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                      .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>.
                      _M_head_impl,frame_count);
  if (in_buffer == (float *)0x0) {
    pfVar5 = (float *)0x0;
  }
  else {
    cubeb_resampler_speex_one_way<float>::input
              ((this->input_processor)._M_t.
               super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl,
               in_buffer,*input_frames_count);
    local_38 = 0;
    pfVar5 = cubeb_resampler_speex_one_way<float>::output
                       ((this->input_processor)._M_t.
                        super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>.
                        _M_head_impl,frame_count,&local_38);
    *input_frames_count = local_38;
  }
  sVar3 = (*this->data_callback)(this->stream,this->user_ptr,pfVar5,pfVar4,frame_count);
  if (((long)frame_count <= (long)sVar3) || (this->draining = true, -1 < (long)sVar3)) {
    pcVar1 = (this->output_processor)._M_t.
             super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
             .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
    (pcVar1->resampling_in_buffer).length_ =
         sVar3 * (pcVar1->super_processor).channels + (ulong)pcVar1->leftover_samples;
    cubeb_resampler_speex_one_way<float>::drop_audio_if_needed
              ((this->input_processor)._M_t.
               super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl);
    sVar3 = cubeb_resampler_speex_one_way<float>::output
                      ((this->output_processor)._M_t.
                       super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                       .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>.
                       _M_head_impl,out_buffer,output_frames_needed);
    cubeb_resampler_speex_one_way<float>::drop_audio_if_needed
              ((this->output_processor)._M_t.
               super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl);
  }
  return sVar3;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_duplex(
    T * in_buffer, long * input_frames_count, T * out_buffer,
    long output_frames_needed)
{
  if (draining) {
    // discard input and drain any signal remaining in the resampler.
    return output_processor->output(out_buffer, output_frames_needed);
  }

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  /* The output buffer passed down in the callback, that might be resampled. */
  T * out_unprocessed = nullptr;
  long output_frames_before_processing = 0;
  /* The number of frames returned from the callback. */
  long got = 0;

  /* We need to determine how much frames to present to the consumer.
   * - If we have a two way stream, but we're only resampling input, we resample
   * the input to the number of output frames.
   * - If we have a two way stream, but we're only resampling the output, we
   * resize the input buffer of the output resampler to the number of input
   * frames, and we resample it afterwards.
   * - If we resample both ways, we resample the input to the number of frames
   * we would need to pass down to the consumer (before resampling the output),
   * get the output data, and resample it to the number of frames needed by the
   * caller. */

  output_frames_before_processing =
      output_processor->input_needed_for_output(output_frames_needed);
  /* fill directly the input buffer of the output processor to save a copy */
  out_unprocessed =
      output_processor->input_buffer(output_frames_before_processing);

  if (in_buffer) {
    /* process the input, and present exactly `output_frames_needed` in the
     * callback. */
    input_processor->input(in_buffer, *input_frames_count);

    size_t frames_resampled = 0;
    resampled_input = input_processor->output(output_frames_before_processing,
                                              &frames_resampled);
    *input_frames_count = frames_resampled;
  } else {
    resampled_input = nullptr;
  }

  got = data_callback(stream, user_ptr, resampled_input, out_unprocessed,
                      output_frames_before_processing);

  if (got < output_frames_before_processing) {
    draining = true;

    if (got < 0) {
      return got;
    }
  }

  output_processor->written(got);

  input_processor->drop_audio_if_needed();

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  got = output_processor->output(out_buffer, output_frames_needed);

  output_processor->drop_audio_if_needed();

  return got;
}